

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::run(WebServer *this)

{
  bool bVar1;
  ostream *__x;
  vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *in_RDI;
  WebServer *in_stack_00000008;
  Task task;
  shared_ptr<HttpData> *it;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *__range2;
  vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> epollInSocket;
  Task *in_stack_fffffffffffffee8;
  element_type *in_stack_fffffffffffffef0;
  _Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
  *in_stack_ffffffffffffff08;
  function<void_(std::shared_ptr<void>)> *in_stack_ffffffffffffff10;
  Task *in_stack_ffffffffffffff18;
  ThreadPool *in_stack_ffffffffffffff20;
  code *in_stack_ffffffffffffff40;
  __normal_iterator<std::shared_ptr<HttpData>_*,_std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined1 local_20 [32];
  
  std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::vector
            ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
             0x117d49);
  do {
    __x = std::operator<<((ostream *)&std::cout,"wait request");
    std::ostream::operator<<(__x,std::endl<char,std::char_traits<char>>);
    handleEvents(in_stack_00000008);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::operator=
              (in_RDI,(vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>
                       *)__x);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::~vector
              (in_RDI);
    local_50 = local_20;
    local_58._M_current =
         (shared_ptr<HttpData> *)
         std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::begin
                   ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>
                     *)in_stack_fffffffffffffee8);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::end
              ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
               in_stack_fffffffffffffee8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<HttpData>_*,_std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<std::shared_ptr<HttpData>_*,_std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<HttpData>_*,_std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>_>
      ::operator*(&local_58);
      Task::Task((Task *)in_stack_fffffffffffffef0);
      in_stack_ffffffffffffff40 = do_request;
      std::bind<void(WebServer::*)(std::shared_ptr<void>),WebServer*,std::_Placeholder<1>const&>
                ((offset_in_WebServer_to_subr *)__x,(WebServer **)in_stack_fffffffffffffef0,
                 (_Placeholder<1> *)in_stack_fffffffffffffee8);
      std::function<void(std::shared_ptr<void>)>::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::shared_ptr<void>::operator=
                ((shared_ptr<void> *)in_stack_fffffffffffffef0,
                 (shared_ptr<HttpData> *)in_stack_fffffffffffffee8);
      in_stack_fffffffffffffef0 =
           std::__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x117e9b);
      Task::Task((Task *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      ThreadPool::appendTask(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      Task::~Task((Task *)in_stack_fffffffffffffef0);
      Task::~Task((Task *)in_stack_fffffffffffffef0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<HttpData>_*,_std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>_>
      ::operator++(&local_58);
    }
    TimerManager::tick((TimerManager *)in_stack_ffffffffffffff40);
  } while( true );
}

Assistant:

void WebServer::run()
{

    std::vector<std::shared_ptr<HttpData>> epollInSocket;

    while (true)
    {
        std::cout << "wait request" << std::endl;

        epollInSocket = handleEvents();
        for (auto &it : epollInSocket)
        {
            Task task;
            task.function = std::bind(&WebServer::do_request, this, std::placeholders::_1);
            task.arg = it;
            threadPool_->appendTask(task);
        }
        /*每次处理完事件后就检查定时器*/
        timerManager->tick();
    }
}